

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::ArmCode::display(ArmCode *this,ostream *o)

{
  pointer puVar1;
  Function *pFVar2;
  char cVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *f;
  pointer puVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,".text",5);
  cVar3 = (char)o;
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  puVar1 = (this->functions).
           super__Vector_base<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->functions).
                super__Vector_base<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    pFVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<arm::Function,_std::default_delete<arm::Function>_>._M_t.
             super__Tuple_impl<0UL,_arm::Function_*,_std::default_delete<arm::Function>_>.
             super__Head_base<0UL,_arm::Function_*,_false>._M_head_impl;
    (**(pFVar2->super_Displayable)._vptr_Displayable)(pFVar2,o);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,".data",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  for (p_Var5 = (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->consts)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    (*(code *)**(undefined8 **)(p_Var5 + 2))(p_Var5 + 2,o);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void ArmCode::display(std::ostream &o) const {
  o << ".text" << std::endl;
  for (auto &f : functions) {
    o << *f << std::endl;
  }

  o << ".data" << std::endl;
  for (auto &v : this->consts) {
    o << v.first << ":" << std::endl;
    o << v.second << std::endl;
  }
  o << std::endl;
}